

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-scanner.hpp
# Opt level: O1

optional<long_long> __thiscall
yactfr::internal::StrScanner::tryScanConstInt<true,false,long_long,false>(StrScanner *this)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  char cVar3;
  ulong in_RDX;
  ulong extraout_RDX;
  char *at;
  type tVar4;
  
  do {
    pcVar1 = this->_at;
    if (pcVar1 == this->_end) break;
    _skipWhitespaces(this);
    in_RDX = extraout_RDX;
  } while (this->_at != pcVar1);
  pcVar1 = this->_at;
  if (pcVar1 == this->_end) {
    cVar3 = -1;
  }
  else {
    cVar3 = *pcVar1;
    this->_at = pcVar1 + 1;
  }
  if (cVar3 < '\0') {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = in_RDX;
    tVar4 = (type)(auVar2 << 0x40);
  }
  else {
    if (cVar3 != '-') {
      this->_at = this->_at + -1;
    }
    tVar4 = (type)_tryScanConstInt<long_long,10>(this,cVar3 == '-');
    if (((undefined1  [16])tVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      this->_at = pcVar1;
    }
  }
  return (optional<long_long>)tVar4;
}

Assistant:

boost::optional<ValT> StrScanner::tryScanConstInt()
{
    static_assert(std::is_same<ValT, long long>::value ||
                  std::is_same<ValT, unsigned long long>::value,
                  "`ValT` is `long long` or `unsigned long long`.");

    this->skipCommentsAndWhitespaces<SkipWsV, SkipCommentsV>();

    const auto at = _at;
    const auto c = this->_scanAnyChar();

    if (c < 0) {
        // nothing left
        return boost::none;
    }

    // check for negation
    const bool negate = (c == '-');

    if (negate && !std::is_signed<ValT>::value) {
        _at = at;
        return boost::none;
    }

    if (!negate) {
        --_at;

        if (AllowPrefixV && c == '+') {
            ++_at;
        }
    }

    // check for radix prefix
    boost::optional<ValT> val;

    if (AllowPrefixV && *_at == '0' && this->charsLeft() >= 2) {
        if (_at[1] == 'b' || _at[1] == 'B' ||
                _at[1] == 'x' || _at[1] == 'X' ||
                (_at[1] >= '1' && _at[1] <= '9')) {
            if (_at[1] == 'b' || _at[1] == 'B') {
                // binary
                _at += 2;
                val = this->_tryScanConstBinInt<ValT>(negate);
            } else if (_at[1] == 'x' || _at[1] == 'X') {
                // hexadecimal
                _at += 2;
                val = this->_tryScanConstInt<ValT, 16>(negate);
            } else {
                // octal: leave prefix to catch 0 too
                assert(_at[1] >= '1' && _at[1] <= '9');
                val = this->_tryScanConstInt<ValT, 8>(negate);
            }

            if (!val) {
                _at = at;
                return boost::none;
            }

            return val;
        }
    }

    // fall back to decimal
    val = this->_tryScanConstInt<ValT, 10>(negate);

    if (!val) {
        // no constant integer
        _at = at;
    }

    return val;
}